

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O1

nodeid_t __thiscall EthUdpPort::InitNodes(EthUdpPort *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ostream *poVar5;
  long *plVar6;
  long lVar7;
  char *pcVar8;
  quadlet_t data;
  undefined4 local_1c;
  
  iVar3 = (*(this->super_EthBasePort).super_BasePort._vptr_BasePort[5])
                    (this,0x3f,0xb,(ulong)(this->sockPtr->ServerAddr).sin_addr.s_addr,0x80);
  if ((char)iVar3 == '\0') {
    poVar5 = (this->super_EthBasePort).super_BasePort.outStr;
    pcVar8 = "InitNodes: failed to write IP address";
    lVar7 = 0x25;
  }
  else {
    Amp1394_Sleep(0.2);
    local_1c = 0;
    iVar3 = (*(this->super_EthBasePort).super_BasePort._vptr_BasePort[4])
                      (this,0x3f,4,&local_1c,0xc0);
    if ((char)iVar3 == '\0') {
      poVar5 = (this->super_EthBasePort).super_BasePort.outStr;
      pcVar8 = "InitNodes: failed to read hardware version for hub/bridge board";
      lVar7 = 0x3f;
    }
    else {
      bVar2 = BasePort::HardwareVersionValid((ulong)local_1c);
      if (!bVar2) {
        poVar5 = (this->super_EthBasePort).super_BasePort.outStr;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"InitNodes: hub board is not a supported board, data = ",0x36);
        *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
             *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        lVar7 = *(long *)poVar5;
        goto LAB_001158c3;
      }
      (this->super_EthBasePort).super_BasePort.FwBusGeneration =
           (this->super_EthBasePort).super_BasePort.newFwBusGeneration;
      poVar5 = (this->super_EthBasePort).super_BasePort.outStr;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"InitNodes: Firewire bus generation = ",0x25);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      local_1c = 0;
      iVar3 = (*(this->super_EthBasePort).super_BasePort._vptr_BasePort[5])(this,0x3f,1,0,0x80);
      if ((char)iVar3 == '\0') {
        poVar5 = (this->super_EthBasePort).super_BasePort.outStr;
        pcVar8 = "InitNodes: failed to broadcast PHY command";
        lVar7 = 0x2a;
      }
      else {
        Amp1394_Sleep(0.01);
        iVar3 = (*(this->super_EthBasePort).super_BasePort._vptr_BasePort[4])
                          (this,0x3f,0,&local_1c,0xc0);
        if ((char)iVar3 != '\0') {
          (this->super_EthBasePort).super_BasePort.HubBoard = local_1c._3_1_ & 0xf;
          poVar5 = (this->super_EthBasePort).super_BasePort.outStr;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"InitNodes: found hub board: ",0x1c);
          plVar6 = (long *)std::ostream::operator<<
                                     ((ostream *)poVar5,
                                      (uint)(this->super_EthBasePort).super_BasePort.HubBoard);
          std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
          std::ostream::put((char)plVar6);
          std::ostream::flush();
          iVar3 = (*(this->super_EthBasePort).super_BasePort._vptr_BasePort[4])
                            (this,0x3f,7,&local_1c,0xc0);
          uVar1 = local_1c;
          if ((char)iVar3 == '\0') {
            poVar5 = (this->super_EthBasePort).super_BasePort.outStr;
            pcVar8 = "InitNodes: unable to read firmware version from hub/bridge board";
            lVar7 = 0x40;
LAB_00115980:
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,lVar7);
            std::endl<char,std::char_traits<char>>(poVar5);
            return 0;
          }
          (this->super_EthBasePort).super_BasePort.FirmwareVersion
          [(this->super_EthBasePort).super_BasePort.HubBoard] = (ulong)local_1c;
          iVar3 = (*(this->super_EthBasePort).super_BasePort._vptr_BasePort[4])
                            (this,0x3f,0xc,&local_1c,0xc0);
          if ((char)iVar3 == '\0') {
            poVar5 = (this->super_EthBasePort).super_BasePort.outStr;
            pcVar8 = "InitNodes: failed to read Ethernet status from hub/bridge board";
            lVar7 = 0x3f;
            goto LAB_00115980;
          }
          uVar4 = BoardIO::GetFpgaVersionMajorFromStatus(local_1c);
          (this->super_EthBasePort).super_BasePort.FpgaVersion
          [(this->super_EthBasePort).super_BasePort.HubBoard] = uVar4;
          if ((this->super_EthBasePort).useFwBridge != false) {
            poVar5 = (this->super_EthBasePort).super_BasePort.outStr;
            pcVar8 = "InitNodes: using Ethernet/Firewire bridge";
            lVar7 = 0x29;
LAB_00115881:
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,lVar7);
            std::endl<char,std::char_traits<char>>(poVar5);
            return 0x10;
          }
          if (8 < uVar1 && uVar4 == 3) {
            poVar5 = (this->super_EthBasePort).super_BasePort.outStr;
            pcVar8 = "InitNodes: using Ethernet network";
            lVar7 = 0x21;
            goto LAB_00115881;
          }
          if (uVar4 == 3) {
            if (8 < uVar1) goto LAB_00115a19;
            poVar5 = (this->super_EthBasePort).super_BasePort.outStr;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"InitNodes: hub board has Firmware Rev ",0x26);
          }
          else {
            poVar5 = (this->super_EthBasePort).super_BasePort.outStr;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"InitNodes: hub board is FPGA V",0x1e);
          }
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
LAB_00115a19:
          poVar5 = (this->super_EthBasePort).super_BasePort.outStr;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,", using Ethernet/Firewire bridge",0x20);
          std::endl<char,std::char_traits<char>>(poVar5);
          (this->super_EthBasePort).useFwBridge = true;
          return 0x10;
        }
        poVar5 = (this->super_EthBasePort).super_BasePort.outStr;
        pcVar8 = "InitNodes: failed to read board id for hub/bridge board";
        lVar7 = 0x37;
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,lVar7);
  lVar7 = *(long *)poVar5;
LAB_001158c3:
  std::ios::widen((char)*(undefined8 *)(lVar7 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  return 0;
}

Assistant:

nodeid_t EthUdpPort::InitNodes(void)
{
    // First, set IP address by Ethernet and FireWire broadcast
    // For Firmware Rev 9+, this also causes the FPGA to send a raw Ethernet multicast quadlet write packet
    // so that the port forwarding database in the FPGA V3 Ethernet Switch gets updated
    if (!WriteQuadletNode(FW_NODE_BROADCAST, BoardIO::IP_ADDR, sockPtr->ServerAddr.sin_addr.s_addr, FW_NODE_ETH_BROADCAST_MASK)) {
        outStr << "InitNodes: failed to write IP address" << std::endl;
        return 0;
    }
    Amp1394_Sleep(0.2);

    quadlet_t data = 0;

    // Check hardware version of hub board
    if (!ReadQuadletNode(FW_NODE_BROADCAST, BoardIO::HARDWARE_VERSION, data,
                         FW_NODE_NOFORWARD_MASK | FW_NODE_ETH_BROADCAST_MASK)) {
        outStr << "InitNodes: failed to read hardware version for hub/bridge board" << std::endl;
        return 0;
    }
    if (!HardwareVersionValid(data)) {
        outStr << "InitNodes: hub board is not a supported board, data = " << std::hex << data << std::endl;
        return 0;
    }

    // ReadQuadletNode should have updated bus generation
    FwBusGeneration = newFwBusGeneration;
    outStr << "InitNodes: Firewire bus generation = " << FwBusGeneration << std::endl;

    // Broadcast a command to initiate a read of Firewire PHY Register 0. In cases where there is no
    // Firewire bus master (i.e., only FPGA/QLA boards on the Firewire bus), this allows each board
    // to obtain its Firewire node id.
    data = 0;
    if (!WriteQuadletNode(FW_NODE_BROADCAST, BoardIO::FW_PHY_REQ, data, FW_NODE_ETH_BROADCAST_MASK)) {
        outStr << "InitNodes: failed to broadcast PHY command" << std::endl;
        return 0;
    }
    Amp1394_Sleep(0.01);

    // Find board id for first board (i.e., one connected by Ethernet) by FireWire and Ethernet broadcast
    if (!ReadQuadletNode(FW_NODE_BROADCAST, BoardIO::BOARD_STATUS, data,
                         FW_NODE_NOFORWARD_MASK | FW_NODE_ETH_BROADCAST_MASK)) {
        outStr << "InitNodes: failed to read board id for hub/bridge board" << std::endl;
        return 0;
    }
    // board_id is bits 27-24, BOARD_ID_MASK = 0x0f000000
    HubBoard = (data & BOARD_ID_MASK) >> 24;
    outStr << "InitNodes: found hub board: " << static_cast<int>(HubBoard) << std::endl;

    // read firmware version
    if (!ReadQuadletNode(FW_NODE_BROADCAST, BoardIO::FIRMWARE_VERSION, data,
                         FW_NODE_NOFORWARD_MASK | FW_NODE_ETH_BROADCAST_MASK)) {
        outStr << "InitNodes: unable to read firmware version from hub/bridge board" << std::endl;
        return 0;
    }
    unsigned long fver = data;
    FirmwareVersion[HubBoard] = data;

    // Get FPGA version of Hub board
    if (!ReadQuadletNode(FW_NODE_BROADCAST, BoardIO::ETH_STATUS, data,
                         FW_NODE_NOFORWARD_MASK | FW_NODE_ETH_BROADCAST_MASK)) {
        outStr << "InitNodes: failed to read Ethernet status from hub/bridge board" << std::endl;
        return 0;
    }
    unsigned long fpga_ver = BoardIO::GetFpgaVersionMajorFromStatus(data);
    FpgaVersion[HubBoard] = fpga_ver;

    if (!useFwBridge && ((fpga_ver != 3) || (fver < 9))) {
        if (fpga_ver != 3)
            outStr << "InitNodes: hub board is FPGA V" << fpga_ver;
        else if (fver < 9)
            outStr << "InitNodes: hub board has Firmware Rev " << fver;
        outStr << ", using Ethernet/Firewire bridge" << std::endl;
        useFwBridge = true;
    }
    else if (useFwBridge)
        outStr << "InitNodes: using Ethernet/Firewire bridge" << std::endl;
    else
        outStr << "InitNodes: using Ethernet network" << std::endl;

    // Scan for up to 16 nodes on bus
    return BoardIO::MAX_BOARDS;
}